

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::ElementsDecodeRawTransactionResponse::ConvertFromStruct
          (ElementsDecodeRawTransactionResponse *this,
          ElementsDecodeRawTransactionResponseStruct *data)

{
  ElementsDecodeRawTransactionResponseStruct *data_local;
  ElementsDecodeRawTransactionResponse *this_local;
  
  std::__cxx11::string::operator=((string *)&this->txid_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->hash_,(string *)&data->hash);
  std::__cxx11::string::operator=((string *)&this->wtxid_,(string *)&data->wtxid);
  std::__cxx11::string::operator=((string *)&this->withash_,(string *)&data->withash);
  this->version_ = data->version;
  this->size_ = data->size;
  this->vsize_ = data->vsize;
  this->weight_ = data->weight;
  this->locktime_ = data->locktime;
  core::
  JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_cfd::js::api::ElementsDecodeRawTransactionTxInStruct>
  ::ConvertFromStruct(&this->vin_,&data->vin);
  core::
  JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxOut,_cfd::js::api::ElementsDecodeRawTransactionTxOutStruct>
  ::ConvertFromStruct(&this->vout_,&data->vout);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void ElementsDecodeRawTransactionResponse::ConvertFromStruct(
    const ElementsDecodeRawTransactionResponseStruct& data) {
  txid_ = data.txid;
  hash_ = data.hash;
  wtxid_ = data.wtxid;
  withash_ = data.withash;
  version_ = data.version;
  size_ = data.size;
  vsize_ = data.vsize;
  weight_ = data.weight;
  locktime_ = data.locktime;
  vin_.ConvertFromStruct(data.vin);
  vout_.ConvertFromStruct(data.vout);
  ignore_items = data.ignore_items;
}